

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_composition_test.cpp
# Opt level: O1

void CatcherComposition_Tests::CatcherComposition_with_3_catchers_works_invoker(void)

{
  unit_test_log_t *puVar1;
  ios_base *this;
  string local_288;
  undefined7 uStack_287;
  long local_278 [2];
  const_string local_268;
  const_string local_258;
  const_string local_248;
  const_string local_238;
  const_string local_228;
  undefined1 local_218 [376];
  value_type *local_a0;
  long local_98;
  value_type local_90;
  undefined7 uStack_8f;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_228.m_end = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90 = '\0';
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"CatcherComposition_with_3_catchers_works",0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_40.m_begin = local_a0;
  local_40.m_end = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_228,0x25,&local_40);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_238.m_end = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90 = '\0';
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"CatcherComposition_with_3_catchers_works",0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_50.m_begin = local_a0;
  local_50.m_end = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_238,0x25,&local_50);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_248.m_end = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90 = '\0';
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"CatcherComposition_with_3_catchers_works",0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_60.m_begin = local_a0;
  local_60.m_end = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_248,0x25,&local_60);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  this = (ios_base *)(local_218 + 0x70);
  std::ios_base::~ios_base(this);
  CatcherComposition_with_3_catchers_works::test_method
            ((CatcherComposition_with_3_catchers_works *)this);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_258.m_end = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90 = '\0';
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"CatcherComposition_with_3_catchers_works",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_70.m_begin = local_a0;
  local_70.m_end = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_258,0x25,&local_70);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_268.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/tests/handler_composition_test.cpp"
  ;
  local_268.m_end = "";
  memset((ostringstream *)local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  local_98 = 0;
  local_90 = '\0';
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"CatcherComposition_with_3_catchers_works",0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_80.m_begin = local_a0;
  local_80.m_end = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_268,0x25,&local_80);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CatcherComposition_with_3_catchers_works)
{
   auto catcher = all_catcher(-1, std_exception_handler(-2, bad_alloc_handler(-3))); // external handler

   try
   {
      throw_bad_alloc();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(-3, catcher.handleException());
   }

   try
   {
      throw_std_exception();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(-2, catcher.handleException());
   }

   try
   {
      throw_int();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(-1, catcher.handleException());
   }
}